

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::srgb_decode_samplerparameterfv
               (NegativeTestContext *ctx)

{
  bool bVar1;
  NotSupportedError *this;
  float params [1];
  GLuint sampler;
  GLfloat local_68;
  GLuint local_64;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"GL_EXT_texture_sRGB_decode","");
  bVar1 = NegativeTestContext::isExtensionSupported(ctx,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    local_68 = 9729.0;
    local_64 = 0x1234;
    glu::CallLogWrapper::glGenSamplers(&ctx->super_CallLogWrapper,1,&local_64);
    local_68 = -1.0;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,
               "GL_INVALID_ENUM is generated if pname is GL_TEXTURE_SRGB_DECODE_EXT and the value of param(s) is not a valid value (one of DECODE_EXT, or SKIP_DECODE_EXT)."
               ,"");
    NegativeTestContext::beginSection(ctx,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glSamplerParameterfv(&ctx->super_CallLogWrapper,local_64,0x8a48,&local_68);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    glu::CallLogWrapper::glDeleteSamplers(&ctx->super_CallLogWrapper,1,&local_64);
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"GL_EXT_texture_sRGB_decode is not supported.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeShaderApiTests.cpp"
             ,0xa04);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void srgb_decode_samplerparameterfv (NegativeTestContext& ctx)
{
	if (!ctx.isExtensionSupported("GL_EXT_texture_sRGB_decode"))
		TCU_THROW(NotSupportedError, "GL_EXT_texture_sRGB_decode is not supported.");

	float	params[1]	= { GL_LINEAR };
	GLuint	sampler		= 0x1234;

	ctx.glGenSamplers(1, &sampler);

	params[0] = -1.0f;
	ctx.beginSection("GL_INVALID_ENUM is generated if pname is GL_TEXTURE_SRGB_DECODE_EXT and the value of param(s) is not a valid value (one of DECODE_EXT, or SKIP_DECODE_EXT).");
	ctx.glSamplerParameterfv(sampler, GL_TEXTURE_SRGB_DECODE_EXT, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.glDeleteSamplers(1, &sampler);
}